

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.h
# Opt level: O0

string * __thiscall
cmGlobalGenerator::FrameworkDescriptor::GetFrameworkPath_abi_cxx11_
          (string *__return_storage_ptr__,FrameworkDescriptor *this)

{
  ulong uVar1;
  string_view local_40;
  char local_29;
  string_view local_28;
  FrameworkDescriptor *local_18;
  FrameworkDescriptor *this_local;
  
  local_18 = this;
  this_local = (FrameworkDescriptor *)__return_storage_ptr__;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    local_29 = '/';
    local_40 = (string_view)::cm::operator____s(".framework",10);
    cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string_const&,cm::static_string_view>
              (__return_storage_ptr__,&this->Directory,&local_29,&this->Name,
               (static_string_view *)&local_40);
  }
  else {
    local_28 = (string_view)::cm::operator____s(".framework",10);
    cmStrCat<std::__cxx11::string_const&,cm::static_string_view>
              (__return_storage_ptr__,&this->Name,(static_string_view *)&local_28);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetFrameworkPath() const
    {
      return this->Directory.empty()
        ? cmStrCat(this->Name, ".framework"_s)
        : cmStrCat(this->Directory, '/', this->Name, ".framework"_s);
    }